

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_file_nlinks(char *file,wchar_t line,char *pathname,wchar_t nlinks)

{
  int iVar1;
  undefined1 local_c0 [4];
  wchar_t r;
  stat st;
  wchar_t nlinks_local;
  char *pathname_local;
  wchar_t line_local;
  char *file_local;
  
  st.__glibc_reserved[2]._4_4_ = nlinks;
  assertion_count(file,line);
  iVar1 = lstat(pathname,(stat *)local_c0);
  if ((iVar1 == 0) && ((wchar_t)st.st_ino == st.__glibc_reserved[2]._4_4_)) {
    file_local._4_4_ = L'\x01';
  }
  else {
    failure_start(file,line,"File %s has %jd links, expected %d",pathname,st.st_ino,
                  (ulong)(uint)st.__glibc_reserved[2]._4_4_);
    failure_finish((void *)0x0);
    file_local._4_4_ = L'\0';
  }
  return file_local._4_4_;
}

Assistant:

int
assertion_file_nlinks(const char *file, int line,
    const char *pathname, int nlinks)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	BY_HANDLE_FILE_INFORMATION bhfi;
	int r;

	assertion_count(file, line);
	r = my_GetFileInformationByName(pathname, &bhfi);
	if (r != 0 && bhfi.nNumberOfLinks == (DWORD)nlinks)
		return (1);
	failure_start(file, line, "File %s has %jd links, expected %d",
	    pathname, (intmax_t)bhfi.nNumberOfLinks, nlinks);
	failure_finish(NULL);
	return (0);
#else
	struct stat st;
	int r;

	assertion_count(file, line);
	r = lstat(pathname, &st);
	if (r == 0 && (int)st.st_nlink == nlinks)
		return (1);
	failure_start(file, line, "File %s has %jd links, expected %d",
	    pathname, (intmax_t)st.st_nlink, nlinks);
	failure_finish(NULL);
	return (0);
#endif
}